

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::synchronization_internal::MoveToList
          (synchronization_internal *this,Rep *r,Vec<int> *src,Vec<int> *dst)

{
  uint uVar1;
  undefined4 *puVar2;
  undefined8 in_RAX;
  long lVar3;
  int32_t w;
  undefined8 uStack_38;
  
  if ((int)src != 0) {
    lVar3 = 0;
    uStack_38 = in_RAX;
    do {
      uVar1 = *(uint *)((long)(r->nodes_).space_ + lVar3 + -8);
      uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38);
      puVar2 = *(undefined4 **)(*(long *)this + (ulong)uVar1 * 8);
      *(undefined4 *)((long)(r->nodes_).space_ + lVar3 + -8) = *puVar2;
      *(undefined1 *)(puVar2 + 3) = 0;
      anon_unknown_0::Vec<int>::push_back(dst,(int *)((long)&uStack_38 + 4));
      lVar3 = lVar3 + 4;
    } while (((ulong)src & 0xffffffff) << 2 != lVar3);
  }
  return;
}

Assistant:

static void MoveToList(
    GraphCycles::Rep* r, Vec<int32_t>* src, Vec<int32_t>* dst) {
  for (auto& v : *src) {
    int32_t w = v;
    // Replace v entry with its rank
    v = r->nodes_[static_cast<uint32_t>(w)]->rank;
    // Prepare for future DFS calls
    r->nodes_[static_cast<uint32_t>(w)]->visited = false;
    dst->push_back(w);
  }
}